

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::LargeHeapBlock::FinishPartialCollect(LargeHeapBlock *this,Recycler *recycler)

{
  undefined4 *puVar1;
  LargeObjectHeader *header;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  uint *address;
  undefined8 *in_FS_OFFSET;
  
  if (this->hasPartialFreeObjects == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x83b,"(this->hasPartialFreeObjects)","this->hasPartialFreeObjects");
    if (!bVar3) {
LAB_00248a71:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (this->allocCount != 0) {
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    uVar4 = 0;
    do {
      header = (LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar4];
      if (header != (LargeObjectHeader *)0x0) {
        bVar3 = IsPartialSweptHeader(this,header);
        if (bVar3) {
          address = (uint *)((ulong)header & 0xfffffffffffffffe);
          if (uVar4 != *address) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar1 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x843,"(header->objectIndex == i)","header->objectIndex == i");
            if (!bVar3) goto LAB_00248a71;
            *puVar1 = 0;
          }
          (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar4] = (_func_int **)0x0;
          FillFreeMemory(this,recycler,address,*(long *)(address + 2) + 0x20);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->allocCount);
  }
  this->hasPartialFreeObjects = false;
  return;
}

Assistant:

void
LargeHeapBlock::FinishPartialCollect(Recycler * recycler)
{
    Assert(this->hasPartialFreeObjects);
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];

        if (header != nullptr && IsPartialSweptHeader(header))
        {
            header = (LargeObjectHeader *)((size_t)header & ~PartialFreeBit);
            Assert(header->objectIndex == i);
            this->HeaderList()[i] = nullptr;
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + header->objectSize);
        }
    }
    DebugOnly(this->hasPartialFreeObjects = false);
}